

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_helicopter>::create
          (factory_item<xray_re::cse_alife_helicopter> *this)

{
  cse_alife_helicopter *this_00;
  
  this_00 = (cse_alife_helicopter *)operator_new(0x1e0);
  xray_re::cse_alife_helicopter::cse_alife_helicopter(this_00);
  (this_00->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
  super_cse_alife_object.super_cse_abstract.m_clsid.field_0 =
       (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}